

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall ON_TextureMapping::ON_TextureMapping(ON_TextureMapping *this,ON_TextureMapping *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_TextureMapping *src_local;
  ON_TextureMapping *this_local;
  
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,TextureMapping,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b72050;
  this->m_type = no_mapping;
  this->m_projection = no_projection;
  this->m_texture_space = single;
  this->m_bCapped = false;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][3];
  (this->m_Pxyz).m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][2];
  (this->m_Pxyz).m_xform[3][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][1];
  (this->m_Pxyz).m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][0];
  (this->m_Pxyz).m_xform[3][1] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][3];
  (this->m_Pxyz).m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][2];
  (this->m_Pxyz).m_xform[2][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][1];
  (this->m_Pxyz).m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][0];
  (this->m_Pxyz).m_xform[2][1] = dVar1;
  dVar7 = ON_Xform::IdentityTransformation.m_xform[1][3];
  dVar6 = ON_Xform::IdentityTransformation.m_xform[1][1];
  dVar5 = ON_Xform::IdentityTransformation.m_xform[1][0];
  dVar4 = ON_Xform::IdentityTransformation.m_xform[0][3];
  dVar3 = ON_Xform::IdentityTransformation.m_xform[0][2];
  dVar2 = ON_Xform::IdentityTransformation.m_xform[0][1];
  dVar1 = ON_Xform::IdentityTransformation.m_xform[0][0];
  (this->m_Pxyz).m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][2];
  (this->m_Pxyz).m_xform[1][3] = dVar7;
  (this->m_Pxyz).m_xform[1][0] = dVar5;
  (this->m_Pxyz).m_xform[1][1] = dVar6;
  (this->m_Pxyz).m_xform[0][2] = dVar3;
  (this->m_Pxyz).m_xform[0][3] = dVar4;
  (this->m_Pxyz).m_xform[0][0] = dVar1;
  (this->m_Pxyz).m_xform[0][1] = dVar2;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][3];
  (this->m_Nxyz).m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][2];
  (this->m_Nxyz).m_xform[3][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][1];
  (this->m_Nxyz).m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][0];
  (this->m_Nxyz).m_xform[3][1] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][3];
  (this->m_Nxyz).m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][2];
  (this->m_Nxyz).m_xform[2][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][1];
  (this->m_Nxyz).m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][0];
  (this->m_Nxyz).m_xform[2][1] = dVar1;
  dVar7 = ON_Xform::IdentityTransformation.m_xform[1][3];
  dVar6 = ON_Xform::IdentityTransformation.m_xform[1][1];
  dVar5 = ON_Xform::IdentityTransformation.m_xform[1][0];
  dVar4 = ON_Xform::IdentityTransformation.m_xform[0][3];
  dVar3 = ON_Xform::IdentityTransformation.m_xform[0][2];
  dVar2 = ON_Xform::IdentityTransformation.m_xform[0][1];
  dVar1 = ON_Xform::IdentityTransformation.m_xform[0][0];
  (this->m_Nxyz).m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][2];
  (this->m_Nxyz).m_xform[1][3] = dVar7;
  (this->m_Nxyz).m_xform[1][0] = dVar5;
  (this->m_Nxyz).m_xform[1][1] = dVar6;
  (this->m_Nxyz).m_xform[0][2] = dVar3;
  (this->m_Nxyz).m_xform[0][3] = dVar4;
  (this->m_Nxyz).m_xform[0][0] = dVar1;
  (this->m_Nxyz).m_xform[0][1] = dVar2;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][3];
  (this->m_uvw).m_xform[3][2] = ON_Xform::IdentityTransformation.m_xform[3][2];
  (this->m_uvw).m_xform[3][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[3][1];
  (this->m_uvw).m_xform[3][0] = ON_Xform::IdentityTransformation.m_xform[3][0];
  (this->m_uvw).m_xform[3][1] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][3];
  (this->m_uvw).m_xform[2][2] = ON_Xform::IdentityTransformation.m_xform[2][2];
  (this->m_uvw).m_xform[2][3] = dVar1;
  dVar1 = ON_Xform::IdentityTransformation.m_xform[2][1];
  (this->m_uvw).m_xform[2][0] = ON_Xform::IdentityTransformation.m_xform[2][0];
  (this->m_uvw).m_xform[2][1] = dVar1;
  dVar7 = ON_Xform::IdentityTransformation.m_xform[1][3];
  dVar6 = ON_Xform::IdentityTransformation.m_xform[1][1];
  dVar5 = ON_Xform::IdentityTransformation.m_xform[1][0];
  dVar4 = ON_Xform::IdentityTransformation.m_xform[0][3];
  dVar3 = ON_Xform::IdentityTransformation.m_xform[0][2];
  dVar2 = ON_Xform::IdentityTransformation.m_xform[0][1];
  dVar1 = ON_Xform::IdentityTransformation.m_xform[0][0];
  (this->m_uvw).m_xform[1][2] = ON_Xform::IdentityTransformation.m_xform[1][2];
  (this->m_uvw).m_xform[1][3] = dVar7;
  (this->m_uvw).m_xform[1][0] = dVar5;
  (this->m_uvw).m_xform[1][1] = dVar6;
  (this->m_uvw).m_xform[0][2] = dVar3;
  (this->m_uvw).m_xform[0][3] = dVar4;
  (this->m_uvw).m_xform[0][0] = dVar1;
  (this->m_uvw).m_xform[0][1] = dVar2;
  std::shared_ptr<const_ON_Object>::shared_ptr(&this->m_mapping_primitive,(nullptr_t)0x0);
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_TextureMapping::ON_TextureMapping( const ON_TextureMapping& src)
  : ON_ModelComponent(ON_ModelComponent::Type::TextureMapping,src)
{
  Internal_CopyFrom(src);
}